

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelling.cpp
# Opt level: O0

void createVars(vec<BoolView> *x,int n)

{
  BoolView *pBVar1;
  int in_ESI;
  vec<BoolView> *in_RDI;
  int in_stack_00000008;
  int in_stack_0000000c;
  int i;
  BoolView *in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffdc;
  vec<BoolView> *in_stack_ffffffffffffffe0;
  undefined4 local_10;
  
  vec<BoolView>::growTo(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  for (local_10 = 0; (int)local_10 < in_ESI; local_10 = local_10 + 1) {
    newBoolVar(in_stack_0000000c,in_stack_00000008);
    pBVar1 = vec<BoolView>::operator[](in_RDI,local_10);
    BoolView::operator=(in_stack_ffffffffffffffd0,pBVar1);
    BoolView::~BoolView((BoolView *)0x2a806a);
  }
  return;
}

Assistant:

void createVars(vec<BoolView>& x, int n) {
	assert(x.size() == 0);
	x.growTo(n);
	for (int i = 0; i < n; i++) {
		x[i] = newBoolVar();
	}
}